

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxSelect(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *val,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *stab,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *bestDelta,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *max,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *update,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *lowBound,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *upBound,int start,int incr)

{
  uint *puVar1;
  uint uVar2;
  int *piVar3;
  undefined8 uVar4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  SPxId *pSVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  DataKey DVar10;
  DataKey DVar11;
  DataKey DVar12;
  DataKey DVar13;
  DataKey DVar14;
  DataKey DVar15;
  ulong uVar16;
  int iVar17;
  uint *puVar18;
  pointer pnVar19;
  cpp_dec_float<50U,_int,_void> *v;
  cpp_dec_float<50U,_int,_void> *pcVar20;
  uint local_194;
  uint local_190;
  undefined1 local_188 [8];
  DataKey DStack_180;
  DataKey local_178;
  uint uStack_170;
  undefined3 uStack_16b;
  uint local_168;
  undefined3 uStack_163;
  int local_160;
  bool local_15c;
  DataKey local_158;
  DataKey local_148;
  DataKey DStack_140;
  DataKey local_138;
  uint uStack_130;
  undefined3 uStack_12b;
  uint local_128;
  undefined3 uStack_123;
  int local_120;
  bool local_11c;
  DataKey local_118;
  undefined4 local_10c;
  pointer local_108;
  cpp_dec_float<50U,_int,_void> *local_100;
  cpp_dec_float<50U,_int,_void> local_f8;
  Type local_bc;
  cpp_dec_float<50U,_int,_void> local_b8;
  DataKey *local_78;
  DataKey *local_70;
  pointer local_68;
  cpp_dec_float<50U,_int,_void> *local_60;
  pointer local_58;
  uint *local_50;
  pointer local_48;
  long local_40;
  uint *local_38;
  
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 10;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  local_118.info = 0;
  local_118.idx = 10;
  local_148.info = 0;
  local_148.idx = 0;
  DStack_140.info = 0;
  DStack_140.idx = 0;
  local_138.info = 0;
  local_138.idx = 0;
  _uStack_130 = 0;
  uStack_12b = 0;
  _local_128 = 0;
  uStack_123 = 0;
  local_120 = 0;
  local_11c = false;
  local_bc = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_type;
  if (local_bc == LEAVE) {
    local_10c = 0;
  }
  else {
    pSVar5 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_10c = (undefined4)CONCAT71((int7)((ulong)pSVar5 >> 8),pSVar5->theRep == ROW);
  }
  local_58 = (upBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_68 = (lowBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_108 = (update->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pnVar19 = (update->thedelta).
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar17 = (update->thedelta).super_IdxSet.num;
  local_194 = 0xffffffff;
  local_190 = 0xffffffff;
  local_100 = &max->m_backend;
  local_78 = (DataKey *)bestDelta;
  local_70 = (DataKey *)val;
  local_60 = &best->m_backend;
  if (start < iVar17) {
    piVar3 = (update->thedelta).super_IdxSet.idx;
    local_38 = (uint *)(piVar3 + iVar17);
    puVar18 = (uint *)(piVar3 + start);
    local_50 = (stab->m_backend).data._M_elems + 1;
    local_40 = (long)incr << 2;
    local_190 = 0xffffffff;
    local_194 = 0xffffffff;
    local_48 = pnVar19;
    do {
      uVar2 = *puVar18;
      uVar4 = *(undefined8 *)((long)&pnVar19[(int)uVar2].m_backend.data + 0x20);
      local_b8.data._M_elems[8] = (uint)uVar4;
      local_b8.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
      uVar4 = *(undefined8 *)&pnVar19[(int)uVar2].m_backend.data;
      uVar7 = *(undefined8 *)((long)&pnVar19[(int)uVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar19[(int)uVar2].m_backend.data + 0x10);
      uVar8 = *(undefined8 *)puVar1;
      uVar9 = *(undefined8 *)(puVar1 + 2);
      local_b8.data._M_elems[4] = (uint)uVar8;
      local_b8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
      local_b8.data._M_elems[6] = (uint)uVar9;
      local_b8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
      local_b8.data._M_elems[0] = (uint)uVar4;
      local_b8.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
      local_b8.data._M_elems[2] = (uint)uVar7;
      local_b8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
      local_b8.exp = pnVar19[(int)uVar2].m_backend.exp;
      local_b8.neg = pnVar19[(int)uVar2].m_backend.neg;
      local_b8.fpclass = pnVar19[(int)uVar2].m_backend.fpclass;
      local_b8.prec_elem = pnVar19[(int)uVar2].m_backend.prec_elem;
      if (local_bc == LEAVE) {
        if (this->iscoid == true) {
          pSVar5 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          iVar17 = pSVar5->theRep *
                   ((pSVar5->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.costat)->data[(int)uVar2];
        }
        else {
          pSVar5 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          iVar17 = pSVar5->theRep *
                   ((pSVar5->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.stat)->data[(int)uVar2];
        }
        if (iVar17 < 1) goto LAB_002b60a1;
      }
      else {
LAB_002b60a1:
        if ((char)local_10c != '\0') {
          pSVar5 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar6 = (pSVar5->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < pSVar6[(int)uVar2].super_DataKey.info) {
            SPxColId::SPxColId((SPxColId *)local_188,pSVar6 + (int)uVar2);
            pnVar19 = local_48;
            iVar17 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar5->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)local_188);
            if ((pSVar5->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar17] == P_FIXED) goto LAB_002b6657;
          }
        }
        if (((local_b8.fpclass == cpp_dec_float_NaN) ||
            ((stab->m_backend).fpclass == cpp_dec_float_NaN)) ||
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_b8,&stab->m_backend), iVar17 < 1)) {
          uVar4 = *(undefined8 *)((stab->m_backend).data._M_elems + 8);
          _local_168 = (undefined5)uVar4;
          uStack_163 = (undefined3)((ulong)uVar4 >> 0x28);
          local_188._0_4_ = (stab->m_backend).data._M_elems[0];
          local_188._4_4_ = (stab->m_backend).data._M_elems[1];
          DStack_180 = *(DataKey *)((stab->m_backend).data._M_elems + 2);
          local_178 = *(DataKey *)((stab->m_backend).data._M_elems + 4);
          uVar4 = *(undefined8 *)((stab->m_backend).data._M_elems + 6);
          _uStack_170 = (undefined5)uVar4;
          uStack_16b = (undefined3)((ulong)uVar4 >> 0x28);
          local_160 = (stab->m_backend).exp;
          local_15c = (stab->m_backend).neg;
          local_158.info = (stab->m_backend).fpclass;
          local_158.idx = (stab->m_backend).prec_elem;
          if (local_188._0_4_ != 0 || local_158.info != 0) {
            local_15c = (bool)(local_15c ^ 1);
          }
          if (((local_158.info != 2) && (local_b8.fpclass != cpp_dec_float_NaN)) &&
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_b8,(cpp_dec_float<50U,_int,_void> *)local_188), iVar17 < 0)
             ) {
            pcVar20 = &local_68[(int)uVar2].m_backend;
            local_f8.fpclass = cpp_dec_float_finite;
            local_f8.prec_elem = 10;
            local_f8.data._M_elems[0] = 0;
            local_f8.data._M_elems[1] = 0;
            local_f8.data._M_elems[2] = 0;
            local_f8.data._M_elems[3] = 0;
            local_f8.data._M_elems[4] = 0;
            local_f8.data._M_elems[5] = 0;
            local_f8.data._M_elems._24_5_ = 0;
            local_f8.data._M_elems[7]._1_3_ = 0;
            local_f8.data._M_elems._32_5_ = 0;
            local_f8.data._M_elems[9]._1_3_ = 0;
            local_f8.exp = 0;
            local_f8.neg = false;
            if (&local_f8 == &local_108[(int)uVar2].m_backend) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_f8,pcVar20);
              if (local_f8.data._M_elems[0] != 0 || local_f8.fpclass != cpp_dec_float_finite) {
                local_f8.neg = (bool)(local_f8.neg ^ 1);
              }
            }
            else {
              if (&local_f8 != pcVar20) {
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                local_f8.data._M_elems._32_5_ = SUB85(uVar4,0);
                local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                local_f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                local_f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                local_f8.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_f8.exp = pcVar20->exp;
                local_f8.neg = pcVar20->neg;
                local_f8.fpclass = pcVar20->fpclass;
                local_f8.prec_elem = pcVar20->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_f8,&local_108[(int)uVar2].m_backend);
            }
            local_158.info = 0;
            local_158.idx = 10;
            local_188._0_4_ = 0;
            local_188._4_4_ = 0;
            DStack_180.info = 0;
            DStack_180.idx = 0;
            local_178.info = 0;
            local_178.idx = 0;
            _uStack_170 = 0;
            uStack_16b = 0;
            _local_168 = 0;
            uStack_163 = 0;
            local_160 = 0;
            local_15c = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)local_188,&local_f8,&local_b8);
            _local_128 = _local_168;
            uStack_123 = uStack_163;
            local_138 = local_178;
            _uStack_130 = _uStack_170;
            uStack_12b = uStack_16b;
            local_148.info = local_188._0_4_;
            local_148.idx = local_188._4_4_;
            DStack_140 = DStack_180;
            local_120 = local_160;
            local_11c = local_15c;
            local_118 = local_158;
            if (((local_158.info == 2) || (local_100->fpclass == cpp_dec_float_NaN)) ||
               (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)&local_148,local_100),
               0 < iVar17)) goto LAB_002b6522;
            DVar15.idx._1_3_ = uStack_123;
            DVar15._0_5_ = _local_128;
            local_70[4] = DVar15;
            DVar13.idx._1_3_ = uStack_12b;
            DVar13._0_5_ = _uStack_130;
            local_70[2] = local_138;
            local_70[3] = DVar13;
            *local_70 = local_148;
            local_70[1] = DStack_140;
            local_70[5].info = local_120;
            *(bool *)&local_70[5].idx = local_11c;
            local_70[6] = local_118;
            (stab->m_backend).data._M_elems[0] = local_b8.data._M_elems[0];
            local_50[8] = local_b8.data._M_elems[9];
            *(ulong *)(local_50 + 4) = CONCAT44(local_b8.data._M_elems[6],local_b8.data._M_elems[5])
            ;
            *(ulong *)(local_50 + 6) = CONCAT44(local_b8.data._M_elems[8],local_b8.data._M_elems[7])
            ;
            *(ulong *)local_50 = CONCAT44(local_b8.data._M_elems[2],local_b8.data._M_elems[1]);
            *(ulong *)(local_50 + 2) = CONCAT44(local_b8.data._M_elems[4],local_b8.data._M_elems[3])
            ;
            (stab->m_backend).exp = local_b8.exp;
            (stab->m_backend).neg =
                 (bool)((local_b8.data._M_elems[0] != 0 || local_b8.fpclass != cpp_dec_float_finite)
                       ^ local_b8.neg);
            (stab->m_backend).fpclass = local_b8.fpclass;
            (stab->m_backend).prec_elem = local_b8.prec_elem;
            local_194 = uVar2;
          }
        }
        else {
          pcVar20 = &local_58[(int)uVar2].m_backend;
          local_f8.fpclass = cpp_dec_float_finite;
          local_f8.prec_elem = 10;
          local_f8.data._M_elems[0] = 0;
          local_f8.data._M_elems[1] = 0;
          local_f8.data._M_elems[2] = 0;
          local_f8.data._M_elems[3] = 0;
          local_f8.data._M_elems[4] = 0;
          local_f8.data._M_elems[5] = 0;
          local_f8.data._M_elems._24_5_ = 0;
          local_f8.data._M_elems[7]._1_3_ = 0;
          local_f8.data._M_elems._32_5_ = 0;
          local_f8.data._M_elems[9]._1_3_ = 0;
          local_f8.exp = 0;
          local_f8.neg = false;
          if (&local_f8 == &local_108[(int)uVar2].m_backend) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_f8,pcVar20);
            if (local_f8.data._M_elems[0] != 0 || local_f8.fpclass != cpp_dec_float_finite) {
              local_f8.neg = (bool)(local_f8.neg ^ 1);
            }
          }
          else {
            if (&local_f8 != pcVar20) {
              uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
              local_f8.data._M_elems._32_5_ = SUB85(uVar4,0);
              local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
              local_f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
              local_f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
              uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
              local_f8.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_f8.exp = pcVar20->exp;
              local_f8.neg = pcVar20->neg;
              local_f8.fpclass = pcVar20->fpclass;
              local_f8.prec_elem = pcVar20->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_f8,&local_108[(int)uVar2].m_backend);
          }
          local_158.info = 0;
          local_158.idx = 10;
          local_188._0_4_ = 0;
          local_188._4_4_ = 0;
          DStack_180.info = 0;
          DStack_180.idx = 0;
          local_178.info = 0;
          local_178.idx = 0;
          _uStack_170 = 0;
          uStack_16b = 0;
          _local_168 = 0;
          uStack_163 = 0;
          local_160 = 0;
          local_15c = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)local_188,&local_f8,&local_b8);
          _local_128 = _local_168;
          uStack_123 = uStack_163;
          local_138 = local_178;
          _uStack_130 = _uStack_170;
          uStack_12b = uStack_16b;
          local_148.info = local_188._0_4_;
          local_148.idx = local_188._4_4_;
          DStack_140 = DStack_180;
          local_120 = local_160;
          local_11c = local_15c;
          local_118 = local_158;
          if (((local_158.info == 2) || (local_100->fpclass == cpp_dec_float_NaN)) ||
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_148,local_100), 0 < iVar17
             )) {
LAB_002b6522:
            pcVar20 = local_60;
            if (((local_118.info != cpp_dec_float_NaN) && (local_60->fpclass != cpp_dec_float_NaN))
               && (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                      ((cpp_dec_float<50U,_int,_void> *)&local_148,local_60),
                  0 < iVar17)) {
              *(ulong *)((pcVar20->data)._M_elems + 8) = CONCAT35(uStack_123,_local_128);
              *(DataKey *)((pcVar20->data)._M_elems + 4) = local_138;
              *(ulong *)((pcVar20->data)._M_elems + 6) = CONCAT35(uStack_12b,_uStack_130);
              (pcVar20->data)._M_elems[0] = local_148.info;
              (pcVar20->data)._M_elems[1] = local_148.idx;
              *(DataKey *)((pcVar20->data)._M_elems + 2) = DStack_140;
              pcVar20->exp = local_120;
              pcVar20->neg = local_11c;
              pcVar20->fpclass = local_118.info;
              pcVar20->prec_elem = local_118.idx;
              local_190 = uVar2;
            }
          }
          else {
            DVar14.idx._1_3_ = uStack_123;
            DVar14._0_5_ = _local_128;
            local_70[4] = DVar14;
            DVar12.idx._1_3_ = uStack_12b;
            DVar12._0_5_ = _uStack_130;
            local_70[2] = local_138;
            local_70[3] = DVar12;
            *local_70 = local_148;
            local_70[1] = DStack_140;
            local_70[5].info = local_120;
            *(bool *)&local_70[5].idx = local_11c;
            local_70[6] = local_118;
            *(ulong *)((stab->m_backend).data._M_elems + 8) =
                 CONCAT44(local_b8.data._M_elems[9],local_b8.data._M_elems[8]);
            *(ulong *)((stab->m_backend).data._M_elems + 4) =
                 CONCAT44(local_b8.data._M_elems[5],local_b8.data._M_elems[4]);
            *(ulong *)((stab->m_backend).data._M_elems + 6) =
                 CONCAT44(local_b8.data._M_elems[7],local_b8.data._M_elems[6]);
            *(ulong *)(stab->m_backend).data._M_elems =
                 CONCAT44(local_b8.data._M_elems[1],local_b8.data._M_elems[0]);
            *(ulong *)((stab->m_backend).data._M_elems + 2) =
                 CONCAT44(local_b8.data._M_elems[3],local_b8.data._M_elems[2]);
            (stab->m_backend).exp = local_b8.exp;
            (stab->m_backend).neg = local_b8.neg;
            (stab->m_backend).fpclass = local_b8.fpclass;
            (stab->m_backend).prec_elem = local_b8.prec_elem;
            local_194 = uVar2;
          }
        }
      }
LAB_002b6657:
      puVar18 = (uint *)((long)puVar18 + local_40);
    } while (puVar18 < local_38);
  }
  if ((int)local_190 < 1 || -1 < (int)local_194) {
    return local_194;
  }
  uVar16 = (ulong)local_190;
  if (pnVar19[uVar16].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_002b673e:
    pcVar20 = &local_108[uVar16].m_backend;
    v = &local_68[uVar16].m_backend;
    local_158.info = 0;
    local_158.idx = 10;
    local_188._0_4_ = 0;
    local_188._4_4_ = 0;
    DStack_180.info = 0;
    DStack_180.idx = 0;
    local_178.info = 0;
    local_178.idx = 0;
    _uStack_170 = 0;
    uStack_16b = 0;
    _local_168 = 0;
    uStack_163 = 0;
    local_160 = 0;
    local_15c = false;
    if ((cpp_dec_float<50U,_int,_void> *)local_188 == v) {
LAB_002b67d7:
      local_158.info = 0;
      local_158.idx = 10;
      local_15c = false;
      local_160 = 0;
      uStack_163 = 0;
      _local_168 = 0;
      uStack_16b = 0;
      _uStack_170 = 0;
      local_178.info = 0;
      local_178.idx = 0;
      DStack_180.info = 0;
      DStack_180.idx = 0;
      local_188._0_4_ = 0;
      local_188._4_4_ = 0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)local_188,pcVar20);
      if (local_188._0_4_ != 0 || local_158.info != cpp_dec_float_finite) {
        local_15c = (bool)(local_15c ^ 1);
      }
      goto LAB_002b67e8;
    }
    if ((cpp_dec_float<50U,_int,_void> *)local_188 != pcVar20) {
      uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
      _local_168 = (undefined5)uVar4;
      uStack_163 = (undefined3)((ulong)uVar4 >> 0x28);
      local_188._0_4_ = (pcVar20->data)._M_elems[0];
      local_188._4_4_ = (pcVar20->data)._M_elems[1];
      DStack_180 = *(DataKey *)((pcVar20->data)._M_elems + 2);
      local_178 = *(DataKey *)((pcVar20->data)._M_elems + 4);
      uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
      _uStack_170 = (undefined5)uVar4;
      uStack_16b = (undefined3)((ulong)uVar4 >> 0x28);
      local_160 = pcVar20->exp;
      local_15c = pcVar20->neg;
      local_158.info = pcVar20->fpclass;
      local_158.idx = pcVar20->prec_elem;
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<50U,_int,_void> *)local_188,0,(type *)0x0);
    iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&pnVar19[uVar16].m_backend,(cpp_dec_float<50U,_int,_void> *)local_188);
    if (iVar17 < 1) goto LAB_002b673e;
    pcVar20 = &local_58[uVar16].m_backend;
    v = &local_108[uVar16].m_backend;
    local_158.info = 0;
    local_158.idx = 10;
    local_188._0_4_ = 0;
    local_188._4_4_ = 0;
    DStack_180.info = 0;
    DStack_180.idx = 0;
    local_178.info = 0;
    local_178.idx = 0;
    _uStack_170 = 0;
    uStack_16b = 0;
    _local_168 = 0;
    uStack_163 = 0;
    local_160 = 0;
    local_15c = false;
    if ((cpp_dec_float<50U,_int,_void> *)local_188 == v) goto LAB_002b67d7;
    if ((cpp_dec_float<50U,_int,_void> *)local_188 != pcVar20) {
      uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
      _local_168 = (undefined5)uVar4;
      uStack_163 = (undefined3)((ulong)uVar4 >> 0x28);
      local_188._0_4_ = (pcVar20->data)._M_elems[0];
      local_188._4_4_ = (pcVar20->data)._M_elems[1];
      DStack_180 = *(DataKey *)((pcVar20->data)._M_elems + 2);
      local_178 = *(DataKey *)((pcVar20->data)._M_elems + 4);
      uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
      _uStack_170 = (undefined5)uVar4;
      uStack_16b = (undefined3)((ulong)uVar4 >> 0x28);
      local_160 = pcVar20->exp;
      local_15c = pcVar20->neg;
      local_158.info = pcVar20->fpclass;
      local_158.idx = pcVar20->prec_elem;
    }
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
            ((cpp_dec_float<50U,_int,_void> *)local_188,v);
LAB_002b67e8:
  DVar11.idx._1_3_ = uStack_163;
  DVar11._0_5_ = _local_168;
  local_78[4] = DVar11;
  DVar10.idx._1_3_ = uStack_16b;
  DVar10._0_5_ = _uStack_170;
  local_78[2] = local_178;
  local_78[3] = DVar10;
  local_78->info = local_188._0_4_;
  local_78->idx = local_188._4_4_;
  local_78[1] = DStack_180;
  local_78[5].info = local_160;
  *(bool *)&local_78[5].idx = local_15c;
  local_78[6] = local_158;
  return local_194;
}

Assistant:

int SPxFastRT<R>::maxSelect(
   R& val,
   R& stab,
   R& best,
   R& bestDelta,
   R max,
   const UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i;
   R x, y;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();
   const int* last = idx + update.delta().size();

   int nr = -1;
   int bestNr = -1;

   for(idx += start; idx < last; idx += incr)
   {
      i = *idx;
      x = upd[i];

      // in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables
      if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                     && this->thesolver->isBasic(i))))
         continue;

      if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
            && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
            == SPxBasisBase<R>::Desc::P_FIXED)
         continue;

      if(x > stab)
      {
         y = (up[i] - vec[i]) / x;

         if(y <= max)
         {
            val = y;
            nr = i;
            stab = x;
         }
         else if(y > best)
         {
            best = y;
            bestNr = i;
         }
      }
      else if(x < -stab)
      {
         y = (low[i] - vec[i]) / x;

         if(y <= max)
         {
            val = y;
            nr = i;
            stab = -x;
         }
         else if(y > best)
         {
            best = y;
            bestNr = i;
         }
      }
   }

   if(nr < 0 && bestNr > 0)
   {
      if(upd[bestNr] > 0)
         bestDelta = up[bestNr] - vec[bestNr];
      else
         bestDelta = vec[bestNr] - low[bestNr];
   }

   return nr;
}